

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O3

void cvarfunc_menu_screenratios(FIntCVar *self)

{
  int in_EDX;
  UCVarValue value;
  
  if (self->Value - 7U < 0xfffffff8) {
    value = (UCVarValue)0xffffffff;
  }
  else {
    if ((self->Value != 4) || (vid_tft.Value)) {
      BuildModesList((screen->super_DSimpleCanvas).super_DCanvas.Width,
                     (screen->super_DSimpleCanvas).super_DCanvas.Height,in_EDX);
      return;
    }
    value.String = (char *)0x0;
  }
  FBaseCVar::SetGenericRep(&self->super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }